

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemDecTiger.cpp
# Opt level: O1

void __thiscall ProblemDecTiger::ConstructObservations(ProblemDecTiger *this)

{
  long *plVar1;
  char *pcVar2;
  long *plVar3;
  int iVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string descr;
  string whatObs;
  string strAgentI;
  string strObsI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string name;
  stringstream ss;
  long *local_2c0;
  long local_2b8;
  long local_2b0;
  long lStack_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  undefined1 *local_260;
  undefined8 local_258;
  undefined1 local_250;
  undefined7 uStack_24f;
  undefined1 *local_240;
  long local_238;
  undefined1 local_230;
  undefined7 uStack_22f;
  ulong local_220;
  ulong local_218;
  long *local_210 [2];
  long local_200 [2];
  string local_1f0;
  ProblemDecTiger *local_1d0;
  MADPComponentDiscreteObservations *local_1c8;
  size_t local_1c0;
  long local_1b8 [2];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  if ((this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
      super_MultiAgentDecisionProcess._m_nrAgents != 0) {
    local_1c8 = &(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete._m_O;
    local_218 = 0;
    local_1d0 = this;
    do {
      local_1c0 = local_1d0->NUMBER_OF_OBSERVATIONS;
      local_220 = local_218;
      if (local_1c0 != 0) {
        uVar5 = 0;
        do {
          local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"o","");
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          local_240 = &local_230;
          local_238 = 0;
          local_230 = 0;
          local_260 = &local_250;
          local_258 = 0;
          local_250 = 0;
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::operator>>((istream *)local_1b8,(string *)&local_260);
          std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_260);
          std::ios::clear((int)*(undefined8 *)(local_1b8[0] + -0x18) +
                          (int)(stringstream *)local_1b8);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::operator>>((istream *)local_1b8,(string *)&local_240);
          std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_240);
          local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
          local_280._M_string_length = 0;
          local_280.field_2._M_local_buf[0] = '\0';
          iVar4 = (int)uVar5;
          if (iVar4 == 0) {
            pcVar2 = "HearLeft";
LAB_003e107f:
            std::__cxx11::string::_M_replace((ulong)&local_280,0,(char *)0x0,(ulong)pcVar2);
          }
          else {
            pcVar2 = "HearRight";
            if (iVar4 == 1) goto LAB_003e107f;
          }
          std::operator+(&local_2a0,":",&local_280);
          std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_2a0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
          }
          local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"Observation ","");
          local_2c0 = &local_2b0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2c0,local_280._M_dataplus._M_p,
                     local_280._M_dataplus._M_p + local_280._M_string_length);
          std::__cxx11::string::append((char *)&local_2c0);
          std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_2c0);
          if (local_2c0 != &local_2b0) {
            operator_delete(local_2c0,local_2b0 + 1);
          }
          local_210[0] = local_200;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_210,local_240,local_240 + local_238);
          std::__cxx11::string::append((char *)local_210);
          plVar1 = (long *)std::__cxx11::string::_M_append((char *)local_210,(ulong)local_260);
          local_2c0 = &local_2b0;
          plVar3 = plVar1 + 2;
          if ((long *)*plVar1 == plVar3) {
            local_2b0 = *plVar3;
            lStack_2a8 = plVar1[3];
          }
          else {
            local_2b0 = *plVar3;
            local_2c0 = (long *)*plVar1;
          }
          local_2b8 = plVar1[1];
          *plVar1 = (long)plVar3;
          plVar1[1] = 0;
          *(undefined1 *)(plVar1 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_2c0);
          if (local_2c0 != &local_2b0) {
            operator_delete(local_2c0,local_2b0 + 1);
          }
          if (local_210[0] != local_200) {
            operator_delete(local_210[0],local_200[0] + 1);
          }
          MADPComponentDiscreteObservations::AddObservation
                    (local_1c8,(Index)local_220,&local_1f0,&local_2a0);
          local_1f0._M_string_length = 0;
          *local_1f0._M_dataplus._M_p = '\0';
          local_238 = 0;
          *local_240 = 0;
          local_258 = 0;
          *local_260 = 0;
          local_280._M_string_length = 0;
          *local_280._M_dataplus._M_p = '\0';
          local_2a0._M_string_length = 0;
          *local_2a0._M_dataplus._M_p = '\0';
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._M_dataplus._M_p != &local_280.field_2) {
            operator_delete(local_280._M_dataplus._M_p,
                            CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                     local_280.field_2._M_local_buf[0]) + 1);
          }
          if (local_260 != &local_250) {
            operator_delete(local_260,CONCAT71(uStack_24f,local_250) + 1);
          }
          if (local_240 != &local_230) {
            operator_delete(local_240,CONCAT71(uStack_22f,local_230) + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base(local_138);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
          uVar5 = (ulong)(iVar4 + 1);
        } while (uVar5 < local_1c0);
      }
      local_218 = (ulong)((int)local_220 + 1);
    } while (local_218 <
             (local_1d0->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
             super_MultiAgentDecisionProcess._m_nrAgents);
  }
  return;
}

Assistant:

void ProblemDecTiger::ConstructObservations()
{
    /// add observations:
    size_t nrJointObservations = 1;
    for(Index agentIndex=0; agentIndex < _m_nrAgents; agentIndex++)
    {
        size_t nrObservationsThisAgent = NUMBER_OF_OBSERVATIONS;
        nrJointObservations *= nrObservationsThisAgent;
    
//         _m_nrObservations.push_back(nrObservationsThisAgent);
//         vector<ObservationDiscrete> ov_temp;
        //Again, this is copied into _m_observationVecs, so no 'new' needed
//        _m_observationVecs.push_back( ov_temp );
        for(Index obsI=0; obsI < nrObservationsThisAgent; obsI++)
        {
            string name("o");
            stringstream ss;
            string strObsI, strAgentI;        
            ss << agentIndex;
            ss >> strAgentI;
            name += strAgentI;
            ss.clear();
            ss << obsI;
            ss >> strObsI;
            name += strObsI; 
            string whatObs;
            switch(obsI){
            case(HEARLEFT):    whatObs = "HearLeft";
                break;
            case(HEARRIGHT):whatObs = "HearRight";
                break;
            }
            name += ":" + whatObs;
            
            string descr("Observation ");
            descr += whatObs + " - #";
            descr += strObsI + " of agent " + strAgentI;
//             ObservationDiscrete od_temp = ObservationDiscrete(obsI,name,descr);
//             _m_observationVecs[agentIndex].push_back( od_temp );
            AddObservation(agentIndex,name,descr);
            name.clear(); 
            strObsI.clear(); 
            strAgentI.clear(); 
            whatObs.clear();
            descr.clear();
        }
    }
}